

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aierror.cpp
# Opt level: O0

string * __thiscall
ai::formatErrno_abi_cxx11_(string *__return_storage_ptr__,ai *this,int error_code)

{
  string local_38;
  int local_14;
  string *psStack_10;
  int error_code_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  stringFromErrno_abi_cxx11_(&local_38,(ai *)((ulong)this & 0xffffffff),error_code);
  formatError(__return_storage_ptr__,(int)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string formatErrno(const int error_code)
    {
        return ai::formatError(error_code, ai::stringFromErrno(error_code));
    }